

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong *puVar24;
  int iVar25;
  uint uVar26;
  undefined4 uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  Geometry *pGVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar43 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar57;
  undefined1 auVar54 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  float fVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar133 [32];
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar144 [32];
  float fVar148;
  float fVar150;
  undefined1 auVar149 [32];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  undefined1 local_e89;
  ulong *local_e88;
  size_t local_e80;
  RayK<8> *local_e78;
  uint local_e70;
  uint local_e6c;
  ulong local_e68;
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  long local_e08;
  long local_e00;
  ulong local_df8;
  ulong local_df0;
  ulong local_de8;
  long local_de0;
  ulong *local_dd8;
  ulong local_dd0;
  ulong local_dc8;
  ulong local_dc0;
  ulong local_db8;
  ulong local_db0;
  ulong local_da8;
  ulong local_da0;
  long local_d98;
  long local_d90;
  Scene *local_d88;
  undefined1 local_d80 [16];
  undefined1 local_d70 [16];
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  RTCFilterFunctionNArguments local_d50;
  Geometry *local_d20;
  undefined1 auStack_d18 [24];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [32];
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float local_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_bf0._4_4_ = uVar27;
  local_bf0._0_4_ = uVar27;
  local_bf0._8_4_ = uVar27;
  local_bf0._12_4_ = uVar27;
  auVar110 = ZEXT1664(local_bf0);
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_c00._4_4_ = uVar27;
  local_c00._0_4_ = uVar27;
  local_c00._8_4_ = uVar27;
  local_c00._12_4_ = uVar27;
  auVar114 = ZEXT1664(local_c00);
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_c10._4_4_ = uVar27;
  local_c10._0_4_ = uVar27;
  local_c10._8_4_ = uVar27;
  local_c10._12_4_ = uVar27;
  auVar122 = ZEXT1664(local_c10);
  fVar143 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar148 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar123 = fVar143 * 0.99999964;
  fVar125 = fVar148 * 0.99999964;
  fVar131 = fVar85 * 0.99999964;
  fVar143 = fVar143 * 1.0000004;
  fVar148 = fVar148 * 1.0000004;
  fVar85 = fVar85 * 1.0000004;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar37 = uVar35 ^ 0x10;
  uVar39 = uVar36 ^ 0x10;
  iVar25 = (tray->tnear).field_0.i[k];
  local_d80._4_4_ = iVar25;
  local_d80._0_4_ = iVar25;
  local_d80._8_4_ = iVar25;
  local_d80._12_4_ = iVar25;
  auVar106 = ZEXT1664(local_d80);
  iVar25 = (tray->tfar).field_0.i[k];
  local_d70._4_4_ = iVar25;
  local_d70._0_4_ = iVar25;
  local_d70._8_4_ = iVar25;
  local_d70._12_4_ = iVar25;
  auVar94 = ZEXT1664(local_d70);
  local_da8 = uVar35 >> 2;
  local_db0 = uVar37 >> 2;
  local_b80._16_16_ = mm_lookupmask_ps._240_16_;
  local_b80._0_16_ = mm_lookupmask_ps._0_16_;
  local_db8 = uVar36 >> 2;
  iVar25 = 1 << ((uint)k & 0x1f);
  local_dc0 = uVar39 >> 2;
  local_dc8 = uVar30 >> 2;
  local_dd0 = (uVar30 ^ 0x10) >> 2;
  auVar44._4_4_ = iVar25;
  auVar44._0_4_ = iVar25;
  auVar44._8_4_ = iVar25;
  auVar44._12_4_ = iVar25;
  auVar44._16_4_ = iVar25;
  auVar44._20_4_ = iVar25;
  auVar44._24_4_ = iVar25;
  auVar44._28_4_ = iVar25;
  auVar45 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar44 = vpand_avx2(auVar44,auVar45);
  local_be0 = vpcmpeqd_avx2(auVar44,auVar45);
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = 0x3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  auVar52._16_4_ = 0x3f800000;
  auVar52._20_4_ = 0x3f800000;
  auVar52._24_4_ = 0x3f800000;
  auVar52._28_4_ = 0x3f800000;
  auVar45._8_4_ = 0xbf800000;
  auVar45._0_8_ = 0xbf800000bf800000;
  auVar45._12_4_ = 0xbf800000;
  auVar45._16_4_ = 0xbf800000;
  auVar45._20_4_ = 0xbf800000;
  auVar45._24_4_ = 0xbf800000;
  auVar45._28_4_ = 0xbf800000;
  _local_ba0 = vblendvps_avx(auVar52,auVar45,local_b80);
  puVar24 = local_7f8;
  fVar91 = fVar85;
  fVar111 = fVar85;
  fVar55 = fVar85;
  fVar56 = fVar123;
  fVar57 = fVar123;
  fVar58 = fVar123;
  fVar59 = fVar125;
  fVar60 = fVar125;
  fVar129 = fVar125;
  fVar134 = fVar131;
  fVar136 = fVar131;
  fVar138 = fVar131;
  fVar145 = fVar143;
  fVar146 = fVar143;
  fVar147 = fVar143;
  fVar150 = fVar148;
  fVar115 = fVar148;
  fVar116 = fVar148;
  local_e80 = k;
  local_e78 = ray;
  local_df0 = uVar36;
  local_de8 = uVar35;
  local_d60 = fVar85;
  fStack_d5c = fVar85;
  fStack_d58 = fVar85;
  fStack_d54 = fVar85;
  local_c60 = fVar148;
  fStack_c5c = fVar148;
  fStack_c58 = fVar148;
  fStack_c54 = fVar148;
  local_c50 = fVar143;
  fStack_c4c = fVar143;
  fStack_c48 = fVar143;
  fStack_c44 = fVar143;
  local_c40 = fVar131;
  fStack_c3c = fVar131;
  fStack_c38 = fVar131;
  fStack_c34 = fVar131;
  local_c30 = fVar125;
  fStack_c2c = fVar125;
  fStack_c28 = fVar125;
  fStack_c24 = fVar125;
  local_c20 = fVar123;
  fStack_c1c = fVar123;
  fStack_c18 = fVar123;
  fStack_c14 = fVar123;
LAB_0162ed4b:
  do {
    local_dd8 = puVar24;
    if (local_dd8 == &local_800) {
LAB_0162fae5:
      return local_dd8 != &local_800;
    }
    local_e88 = local_dd8 + -1;
    uVar38 = local_dd8[-1];
    while ((uVar38 & 8) == 0) {
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar35),auVar110._0_16_);
      auVar40._0_4_ = fVar123 * auVar43._0_4_;
      auVar40._4_4_ = fVar56 * auVar43._4_4_;
      auVar40._8_4_ = fVar57 * auVar43._8_4_;
      auVar40._12_4_ = fVar58 * auVar43._12_4_;
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar36),auVar114._0_16_);
      auVar49._0_4_ = fVar125 * auVar43._0_4_;
      auVar49._4_4_ = fVar59 * auVar43._4_4_;
      auVar49._8_4_ = fVar60 * auVar43._8_4_;
      auVar49._12_4_ = fVar129 * auVar43._12_4_;
      auVar43 = vmaxps_avx(auVar40,auVar49);
      auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar30),auVar122._0_16_);
      auVar50._0_4_ = fVar131 * auVar40._0_4_;
      auVar50._4_4_ = fVar134 * auVar40._4_4_;
      auVar50._8_4_ = fVar136 * auVar40._8_4_;
      auVar50._12_4_ = fVar138 * auVar40._12_4_;
      auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar37),auVar110._0_16_);
      auVar61._0_4_ = fVar143 * auVar40._0_4_;
      auVar61._4_4_ = fVar145 * auVar40._4_4_;
      auVar61._8_4_ = fVar146 * auVar40._8_4_;
      auVar61._12_4_ = fVar147 * auVar40._12_4_;
      auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar39),auVar114._0_16_);
      auVar72._0_4_ = fVar148 * auVar40._0_4_;
      auVar72._4_4_ = fVar150 * auVar40._4_4_;
      auVar72._8_4_ = fVar115 * auVar40._8_4_;
      auVar72._12_4_ = fVar116 * auVar40._12_4_;
      auVar49 = vminps_avx(auVar61,auVar72);
      auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar30 ^ 0x10)),auVar122._0_16_);
      auVar73._0_4_ = fVar85 * auVar40._0_4_;
      auVar73._4_4_ = fVar91 * auVar40._4_4_;
      auVar73._8_4_ = fVar111 * auVar40._8_4_;
      auVar73._12_4_ = fVar55 * auVar40._12_4_;
      auVar40 = vmaxps_avx(auVar50,auVar106._0_16_);
      auVar43 = vmaxps_avx(auVar43,auVar40);
      auVar40 = vminps_avx(auVar73,auVar94._0_16_);
      auVar40 = vminps_avx(auVar49,auVar40);
      auVar43 = vcmpps_avx(auVar43,auVar40,2);
      uVar26 = vmovmskps_avx(auVar43);
      puVar24 = local_e88;
      if (uVar26 == 0) goto LAB_0162ed4b;
      uVar26 = uVar26 & 0xff;
      uVar28 = uVar38 & 0xfffffffffffffff0;
      lVar29 = 0;
      for (uVar38 = (ulong)uVar26; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar38 = *(ulong *)(uVar28 + lVar29 * 8);
      uVar26 = uVar26 - 1 & uVar26;
      uVar32 = (ulong)uVar26;
      if (uVar26 != 0) {
        do {
          *local_e88 = uVar38;
          local_e88 = local_e88 + 1;
          lVar29 = 0;
          for (uVar38 = uVar32; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          uVar38 = *(ulong *)(uVar28 + lVar29 * 8);
        } while (uVar32 != 0);
      }
    }
    local_e08 = (ulong)((uint)uVar38 & 0xf) - 8;
    uVar38 = uVar38 & 0xfffffffffffffff0;
    for (local_e00 = 0; puVar24 = local_e88, local_e00 != local_e08; local_e00 = local_e00 + 1) {
      lVar29 = local_e00 * 0x58;
      local_de0 = uVar38 + lVar29;
      uVar27 = *(undefined4 *)(uVar38 + 0x38 + lVar29);
      auVar62._4_4_ = uVar27;
      auVar62._0_4_ = uVar27;
      auVar62._8_4_ = uVar27;
      auVar62._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(uVar38 + 0x44 + lVar29);
      auVar74._4_4_ = uVar27;
      auVar74._0_4_ = uVar27;
      auVar74._8_4_ = uVar27;
      auVar74._12_4_ = uVar27;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)(local_da8 + 0x20 + local_de0);
      auVar43 = vpmovzxbd_avx(auVar43);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar40 = vfmadd213ps_fma(auVar43,auVar74,auVar62);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(local_db0 + 0x20 + local_de0);
      auVar43 = vpmovzxbd_avx(auVar41);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar49 = vfmadd213ps_fma(auVar43,auVar74,auVar62);
      uVar27 = *(undefined4 *)(uVar38 + 0x3c + lVar29);
      auVar63._4_4_ = uVar27;
      auVar63._0_4_ = uVar27;
      auVar63._8_4_ = uVar27;
      auVar63._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(uVar38 + 0x48 + lVar29);
      auVar75._4_4_ = uVar27;
      auVar75._0_4_ = uVar27;
      auVar75._8_4_ = uVar27;
      auVar75._12_4_ = uVar27;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)(local_db8 + 0x20 + local_de0);
      auVar43 = vpmovzxbd_avx(auVar86);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar61 = vfmadd213ps_fma(auVar43,auVar75,auVar63);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)(local_dc0 + 0x20 + local_de0);
      auVar43 = vpmovzxbd_avx(auVar92);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar72 = vfmadd213ps_fma(auVar43,auVar75,auVar63);
      uVar27 = *(undefined4 *)(uVar38 + 0x40 + lVar29);
      auVar64._4_4_ = uVar27;
      auVar64._0_4_ = uVar27;
      auVar64._8_4_ = uVar27;
      auVar64._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(uVar38 + 0x4c + lVar29);
      auVar76._4_4_ = uVar27;
      auVar76._0_4_ = uVar27;
      auVar76._8_4_ = uVar27;
      auVar76._12_4_ = uVar27;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = *(ulong *)(local_dc8 + 0x20 + local_de0);
      auVar43 = vpmovzxbd_avx(auVar95);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar73 = vfmadd213ps_fma(auVar43,auVar76,auVar64);
      auVar102._8_8_ = 0;
      auVar102._0_8_ = *(ulong *)(local_dd0 + 0x20 + local_de0);
      auVar43 = vpmovzxbd_avx(auVar102);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar41 = vfmadd213ps_fma(auVar43,auVar76,auVar64);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(uVar38 + 0x20 + lVar29);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)(uVar38 + 0x24 + lVar29);
      auVar43 = vpminub_avx(auVar65,auVar77);
      auVar50 = vpcmpeqb_avx(auVar65,auVar43);
      auVar43 = vsubps_avx(auVar40,auVar110._0_16_);
      auVar51._0_4_ = fVar123 * auVar43._0_4_;
      auVar51._4_4_ = fVar56 * auVar43._4_4_;
      auVar51._8_4_ = fVar57 * auVar43._8_4_;
      auVar51._12_4_ = fVar58 * auVar43._12_4_;
      auVar43 = vsubps_avx(auVar61,auVar114._0_16_);
      auVar78._0_4_ = fVar125 * auVar43._0_4_;
      auVar78._4_4_ = fVar59 * auVar43._4_4_;
      auVar78._8_4_ = fVar60 * auVar43._8_4_;
      auVar78._12_4_ = fVar129 * auVar43._12_4_;
      auVar43 = vmaxps_avx(auVar51,auVar78);
      auVar40 = vsubps_avx(auVar49,auVar110._0_16_);
      auVar42._0_4_ = fVar143 * auVar40._0_4_;
      auVar42._4_4_ = fVar145 * auVar40._4_4_;
      auVar42._8_4_ = fVar146 * auVar40._8_4_;
      auVar42._12_4_ = fVar147 * auVar40._12_4_;
      auVar40 = vsubps_avx(auVar72,auVar114._0_16_);
      auVar79._0_4_ = fVar148 * auVar40._0_4_;
      auVar79._4_4_ = fVar150 * auVar40._4_4_;
      auVar79._8_4_ = fVar115 * auVar40._8_4_;
      auVar79._12_4_ = fVar116 * auVar40._12_4_;
      auVar49 = vminps_avx(auVar42,auVar79);
      auVar40 = vsubps_avx(auVar73,auVar122._0_16_);
      auVar80._0_4_ = fVar131 * auVar40._0_4_;
      auVar80._4_4_ = fVar134 * auVar40._4_4_;
      auVar80._8_4_ = fVar136 * auVar40._8_4_;
      auVar80._12_4_ = fVar138 * auVar40._12_4_;
      auVar40 = vmaxps_avx(auVar80,local_d80);
      auVar43 = vmaxps_avx(auVar43,auVar40);
      auVar40 = vsubps_avx(auVar41,auVar122._0_16_);
      auVar81._0_4_ = local_d60 * auVar40._0_4_;
      auVar81._4_4_ = fStack_d5c * auVar40._4_4_;
      auVar81._8_4_ = fStack_d58 * auVar40._8_4_;
      auVar81._12_4_ = fStack_d54 * auVar40._12_4_;
      auVar40 = vminps_avx(auVar81,local_d70);
      auVar40 = vminps_avx(auVar49,auVar40);
      auVar43 = vcmpps_avx(auVar43,auVar40,2);
      auVar40 = vpmovzxbd_avx(auVar50 ^ _DAT_01f46b70);
      auVar43 = vpandn_avx(auVar40,auVar43);
      auVar43 = vpslld_avx(auVar43,0x1f);
      uVar27 = vmovmskps_avx(auVar43);
      for (local_da0 = CONCAT44((int)((ulong)lVar29 >> 0x20),uVar27); auVar94 = ZEXT1664(local_d70),
          local_da0 != 0; local_da0 = local_da0 - 1 & local_da0) {
        lVar29 = 0;
        for (uVar35 = local_da0; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar1 = *(ushort *)(local_de0 + lVar29 * 8);
        uVar2 = *(ushort *)(local_de0 + 2 + lVar29 * 8);
        local_ca0._4_4_ = *(uint *)(local_de0 + 0x50);
        local_e68 = (ulong)local_ca0._4_4_;
        uVar26 = *(uint *)(local_de0 + 4 + lVar29 * 8);
        local_df8 = (ulong)uVar26;
        local_d88 = context->scene;
        pGVar34 = (local_d88->geometries).items[local_e68].ptr;
        local_d90 = *(long *)&pGVar34->field_0x58;
        local_d98 = pGVar34[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                    local_df8;
        local_e6c = uVar1 & 0x7fff;
        local_e70 = uVar2 & 0x7fff;
        uVar3 = *(uint *)(local_d90 + 4 + local_d98);
        uVar28 = (ulong)uVar3;
        uVar36 = (ulong)(uVar3 * local_e70 + *(int *)(local_d90 + local_d98) + local_e6c);
        lVar29 = *(long *)&pGVar34[1].time_range.upper;
        p_Var4 = pGVar34[1].intersectionFilterN;
        auVar43 = *(undefined1 (*) [16])(lVar29 + (uVar36 + 1) * (long)p_Var4);
        auVar40 = *(undefined1 (*) [16])(lVar29 + (uVar36 + uVar28) * (long)p_Var4);
        lVar31 = uVar36 + uVar28 + 1;
        auVar49 = *(undefined1 (*) [16])(lVar29 + lVar31 * (long)p_Var4);
        auVar50 = *(undefined1 (*) [16])(lVar29 + (uVar36 + (-1 < (short)uVar1) + 1) * (long)p_Var4)
        ;
        lVar33 = (ulong)(-1 < (short)uVar1) + lVar31;
        uVar35 = 0;
        if (-1 < (short)uVar2) {
          uVar35 = uVar28;
        }
        auVar61 = *(undefined1 (*) [16])(lVar29 + lVar33 * (long)p_Var4);
        auVar72 = *(undefined1 (*) [16])(lVar29 + (uVar36 + uVar28 + uVar35) * (long)p_Var4);
        auVar73 = *(undefined1 (*) [16])(lVar29 + (lVar31 + uVar35) * (long)p_Var4);
        auVar107._16_16_ = *(undefined1 (*) [16])(lVar29 + (uVar35 + lVar33) * (long)p_Var4);
        auVar107._0_16_ = auVar49;
        auVar42 = vunpcklps_avx(auVar43,auVar61);
        auVar41 = vunpckhps_avx(auVar43,auVar61);
        auVar51 = vunpcklps_avx(auVar50,auVar49);
        auVar50 = vunpckhps_avx(auVar50,auVar49);
        auVar62 = vunpcklps_avx(auVar41,auVar50);
        auVar63 = vunpcklps_avx(auVar42,auVar51);
        auVar50 = vunpckhps_avx(auVar42,auVar51);
        auVar42 = vunpcklps_avx(auVar40,auVar73);
        auVar41 = vunpckhps_avx(auVar40,auVar73);
        auVar51 = vunpcklps_avx(auVar49,auVar72);
        auVar72 = vunpckhps_avx(auVar49,auVar72);
        auVar41 = vunpcklps_avx(auVar41,auVar72);
        auVar64 = vunpcklps_avx(auVar42,auVar51);
        auVar72 = vunpckhps_avx(auVar42,auVar51);
        auVar66._16_16_ = auVar73;
        auVar66._0_16_ = auVar40;
        auVar53._16_16_ = auVar61;
        auVar53._0_16_ = auVar43;
        auVar44 = vunpcklps_avx(auVar53,auVar66);
        auVar46._16_16_ = auVar49;
        auVar46._0_16_ = *(undefined1 (*) [16])(lVar29 + (long)p_Var4 * uVar36);
        auVar45 = vunpcklps_avx(auVar46,auVar107);
        auVar105 = vunpcklps_avx(auVar45,auVar44);
        auVar44 = vunpckhps_avx(auVar45,auVar44);
        auVar45 = vunpckhps_avx(auVar53,auVar66);
        auVar52 = vunpckhps_avx(auVar46,auVar107);
        auVar45 = vunpcklps_avx(auVar52,auVar45);
        auVar149._16_16_ = auVar63;
        auVar149._0_16_ = auVar63;
        auVar67._16_16_ = auVar50;
        auVar67._0_16_ = auVar50;
        auVar87._16_16_ = auVar62;
        auVar87._0_16_ = auVar62;
        auVar108._16_16_ = auVar64;
        auVar108._0_16_ = auVar64;
        auVar112._16_16_ = auVar72;
        auVar112._0_16_ = auVar72;
        uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4);
        auVar121._4_4_ = uVar27;
        auVar121._0_4_ = uVar27;
        auVar121._8_4_ = uVar27;
        auVar121._12_4_ = uVar27;
        auVar121._16_4_ = uVar27;
        auVar121._20_4_ = uVar27;
        auVar121._24_4_ = uVar27;
        auVar121._28_4_ = uVar27;
        uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x20);
        auVar124._4_4_ = uVar27;
        auVar124._0_4_ = uVar27;
        auVar124._8_4_ = uVar27;
        auVar124._12_4_ = uVar27;
        auVar124._16_4_ = uVar27;
        auVar124._20_4_ = uVar27;
        auVar124._24_4_ = uVar27;
        auVar124._28_4_ = uVar27;
        auVar96._16_16_ = auVar41;
        auVar96._0_16_ = auVar41;
        uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x40);
        auVar133._4_4_ = uVar27;
        auVar133._0_4_ = uVar27;
        auVar133._8_4_ = uVar27;
        auVar133._12_4_ = uVar27;
        auVar133._16_4_ = uVar27;
        auVar133._20_4_ = uVar27;
        auVar133._24_4_ = uVar27;
        auVar133._28_4_ = uVar27;
        auVar105 = vsubps_avx(auVar105,auVar121);
        auVar46 = vsubps_avx(auVar44,auVar124);
        auVar44 = vsubps_avx(auVar45,auVar133);
        auVar45 = vsubps_avx(auVar149,auVar121);
        auVar52 = vsubps_avx(auVar67,auVar124);
        auVar101 = vsubps_avx(auVar87,auVar133);
        auVar53 = vsubps_avx(auVar108,auVar121);
        auVar66 = vsubps_avx(auVar112,auVar124);
        auVar5 = vsubps_avx(auVar96,auVar133);
        auVar67 = vsubps_avx(auVar53,auVar105);
        auVar87 = vsubps_avx(auVar66,auVar46);
        local_aa0 = vsubps_avx(auVar5,auVar44);
        auVar47._0_4_ = auVar53._0_4_ + auVar105._0_4_;
        auVar47._4_4_ = auVar53._4_4_ + auVar105._4_4_;
        auVar47._8_4_ = auVar53._8_4_ + auVar105._8_4_;
        auVar47._12_4_ = auVar53._12_4_ + auVar105._12_4_;
        auVar47._16_4_ = auVar53._16_4_ + auVar105._16_4_;
        auVar47._20_4_ = auVar53._20_4_ + auVar105._20_4_;
        auVar47._24_4_ = auVar53._24_4_ + auVar105._24_4_;
        auVar47._28_4_ = auVar53._28_4_ + auVar105._28_4_;
        auVar68._0_4_ = auVar46._0_4_ + auVar66._0_4_;
        auVar68._4_4_ = auVar46._4_4_ + auVar66._4_4_;
        auVar68._8_4_ = auVar46._8_4_ + auVar66._8_4_;
        auVar68._12_4_ = auVar46._12_4_ + auVar66._12_4_;
        auVar68._16_4_ = auVar46._16_4_ + auVar66._16_4_;
        auVar68._20_4_ = auVar46._20_4_ + auVar66._20_4_;
        auVar68._24_4_ = auVar46._24_4_ + auVar66._24_4_;
        auVar68._28_4_ = auVar46._28_4_ + auVar66._28_4_;
        fVar143 = auVar44._0_4_;
        auVar97._0_4_ = auVar5._0_4_ + fVar143;
        fVar148 = auVar44._4_4_;
        auVar97._4_4_ = auVar5._4_4_ + fVar148;
        fVar85 = auVar44._8_4_;
        auVar97._8_4_ = auVar5._8_4_ + fVar85;
        fVar123 = auVar44._12_4_;
        auVar97._12_4_ = auVar5._12_4_ + fVar123;
        fVar125 = auVar44._16_4_;
        auVar97._16_4_ = auVar5._16_4_ + fVar125;
        fVar131 = auVar44._20_4_;
        auVar97._20_4_ = auVar5._20_4_ + fVar131;
        fVar91 = auVar44._24_4_;
        auVar97._24_4_ = auVar5._24_4_ + fVar91;
        auVar97._28_4_ = auVar5._28_4_ + auVar44._28_4_;
        auVar6._4_4_ = local_aa0._4_4_ * auVar68._4_4_;
        auVar6._0_4_ = local_aa0._0_4_ * auVar68._0_4_;
        auVar6._8_4_ = local_aa0._8_4_ * auVar68._8_4_;
        auVar6._12_4_ = local_aa0._12_4_ * auVar68._12_4_;
        auVar6._16_4_ = local_aa0._16_4_ * auVar68._16_4_;
        auVar6._20_4_ = local_aa0._20_4_ * auVar68._20_4_;
        auVar6._24_4_ = local_aa0._24_4_ * auVar68._24_4_;
        auVar6._28_4_ = uVar27;
        auVar40 = vfmsub231ps_fma(auVar6,auVar87,auVar97);
        auVar7._4_4_ = auVar67._4_4_ * auVar97._4_4_;
        auVar7._0_4_ = auVar67._0_4_ * auVar97._0_4_;
        auVar7._8_4_ = auVar67._8_4_ * auVar97._8_4_;
        auVar7._12_4_ = auVar67._12_4_ * auVar97._12_4_;
        auVar7._16_4_ = auVar67._16_4_ * auVar97._16_4_;
        auVar7._20_4_ = auVar67._20_4_ * auVar97._20_4_;
        auVar7._24_4_ = auVar67._24_4_ * auVar97._24_4_;
        auVar7._28_4_ = auVar97._28_4_;
        auVar43 = vfmsub231ps_fma(auVar7,local_aa0,auVar47);
        auVar8._4_4_ = auVar87._4_4_ * auVar47._4_4_;
        auVar8._0_4_ = auVar87._0_4_ * auVar47._0_4_;
        auVar8._8_4_ = auVar87._8_4_ * auVar47._8_4_;
        auVar8._12_4_ = auVar87._12_4_ * auVar47._12_4_;
        auVar8._16_4_ = auVar87._16_4_ * auVar47._16_4_;
        auVar8._20_4_ = auVar87._20_4_ * auVar47._20_4_;
        auVar8._24_4_ = auVar87._24_4_ * auVar47._24_4_;
        auVar8._28_4_ = auVar47._28_4_;
        auVar49 = vfmsub231ps_fma(auVar8,auVar67,auVar68);
        uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0xa0);
        local_e40._4_4_ = uVar27;
        local_e40._0_4_ = uVar27;
        local_e40._8_4_ = uVar27;
        local_e40._12_4_ = uVar27;
        local_e40._16_4_ = uVar27;
        local_e40._20_4_ = uVar27;
        local_e40._24_4_ = uVar27;
        local_e40._28_4_ = uVar27;
        local_ac0 = *(float *)(local_e78 + local_e80 * 4 + 0xc0);
        auVar9._4_4_ = local_ac0 * auVar49._4_4_;
        auVar9._0_4_ = local_ac0 * auVar49._0_4_;
        auVar9._8_4_ = local_ac0 * auVar49._8_4_;
        auVar9._12_4_ = local_ac0 * auVar49._12_4_;
        auVar9._16_4_ = local_ac0 * 0.0;
        auVar9._20_4_ = local_ac0 * 0.0;
        auVar9._24_4_ = local_ac0 * 0.0;
        auVar9._28_4_ = auVar68._28_4_;
        auVar43 = vfmadd231ps_fma(auVar9,local_e40,ZEXT1632(auVar43));
        uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x80);
        local_e60._4_4_ = uVar27;
        local_e60._0_4_ = uVar27;
        local_e60._8_4_ = uVar27;
        local_e60._12_4_ = uVar27;
        local_e60._16_4_ = uVar27;
        local_e60._20_4_ = uVar27;
        local_e60._24_4_ = uVar27;
        local_e60._28_4_ = uVar27;
        auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),local_e60,ZEXT1632(auVar40));
        local_ae0 = vsubps_avx(auVar46,auVar52);
        local_b00 = vsubps_avx(auVar44,auVar101);
        auVar144._0_4_ = auVar46._0_4_ + auVar52._0_4_;
        auVar144._4_4_ = auVar46._4_4_ + auVar52._4_4_;
        auVar144._8_4_ = auVar46._8_4_ + auVar52._8_4_;
        auVar144._12_4_ = auVar46._12_4_ + auVar52._12_4_;
        auVar144._16_4_ = auVar46._16_4_ + auVar52._16_4_;
        auVar144._20_4_ = auVar46._20_4_ + auVar52._20_4_;
        auVar144._24_4_ = auVar46._24_4_ + auVar52._24_4_;
        auVar144._28_4_ = auVar46._28_4_ + auVar52._28_4_;
        auVar98._0_4_ = fVar143 + auVar101._0_4_;
        auVar98._4_4_ = fVar148 + auVar101._4_4_;
        auVar98._8_4_ = fVar85 + auVar101._8_4_;
        auVar98._12_4_ = fVar123 + auVar101._12_4_;
        auVar98._16_4_ = fVar125 + auVar101._16_4_;
        auVar98._20_4_ = fVar131 + auVar101._20_4_;
        auVar98._24_4_ = fVar91 + auVar101._24_4_;
        fVar111 = auVar101._28_4_;
        auVar98._28_4_ = auVar44._28_4_ + fVar111;
        fVar55 = local_b00._0_4_;
        fVar57 = local_b00._4_4_;
        auVar10._4_4_ = auVar144._4_4_ * fVar57;
        auVar10._0_4_ = auVar144._0_4_ * fVar55;
        fVar59 = local_b00._8_4_;
        auVar10._8_4_ = auVar144._8_4_ * fVar59;
        fVar129 = local_b00._12_4_;
        auVar10._12_4_ = auVar144._12_4_ * fVar129;
        fVar136 = local_b00._16_4_;
        auVar10._16_4_ = auVar144._16_4_ * fVar136;
        fVar145 = local_b00._20_4_;
        auVar10._20_4_ = auVar144._20_4_ * fVar145;
        fVar147 = local_b00._24_4_;
        auVar10._24_4_ = auVar144._24_4_ * fVar147;
        auVar10._28_4_ = auVar67._28_4_;
        auVar49 = vfmsub231ps_fma(auVar10,local_ae0,auVar98);
        local_b20 = vsubps_avx(auVar105,auVar45);
        fVar56 = local_b20._0_4_;
        fVar58 = local_b20._4_4_;
        auVar11._4_4_ = auVar98._4_4_ * fVar58;
        auVar11._0_4_ = auVar98._0_4_ * fVar56;
        fVar60 = local_b20._8_4_;
        auVar11._8_4_ = auVar98._8_4_ * fVar60;
        fVar134 = local_b20._12_4_;
        auVar11._12_4_ = auVar98._12_4_ * fVar134;
        fVar138 = local_b20._16_4_;
        auVar11._16_4_ = auVar98._16_4_ * fVar138;
        fVar146 = local_b20._20_4_;
        auVar11._20_4_ = auVar98._20_4_ * fVar146;
        fVar150 = local_b20._24_4_;
        auVar11._24_4_ = auVar98._24_4_ * fVar150;
        auVar11._28_4_ = local_aa0._28_4_;
        auVar99._0_4_ = auVar105._0_4_ + auVar45._0_4_;
        auVar99._4_4_ = auVar105._4_4_ + auVar45._4_4_;
        auVar99._8_4_ = auVar105._8_4_ + auVar45._8_4_;
        auVar99._12_4_ = auVar105._12_4_ + auVar45._12_4_;
        auVar99._16_4_ = auVar105._16_4_ + auVar45._16_4_;
        auVar99._20_4_ = auVar105._20_4_ + auVar45._20_4_;
        auVar99._24_4_ = auVar105._24_4_ + auVar45._24_4_;
        auVar99._28_4_ = auVar105._28_4_ + auVar45._28_4_;
        auVar40 = vfmsub231ps_fma(auVar11,local_b00,auVar99);
        fVar132 = local_ae0._0_4_;
        fVar135 = local_ae0._4_4_;
        auVar12._4_4_ = fVar135 * auVar99._4_4_;
        auVar12._0_4_ = fVar132 * auVar99._0_4_;
        fVar137 = local_ae0._8_4_;
        auVar12._8_4_ = fVar137 * auVar99._8_4_;
        fVar139 = local_ae0._12_4_;
        auVar12._12_4_ = fVar139 * auVar99._12_4_;
        fVar140 = local_ae0._16_4_;
        auVar12._16_4_ = fVar140 * auVar99._16_4_;
        fVar141 = local_ae0._20_4_;
        auVar12._20_4_ = fVar141 * auVar99._20_4_;
        fVar142 = local_ae0._24_4_;
        auVar12._24_4_ = fVar142 * auVar99._24_4_;
        auVar12._28_4_ = auVar99._28_4_;
        auVar50 = vfmsub231ps_fma(auVar12,local_b20,auVar144);
        auVar100._0_4_ = local_ac0 * auVar50._0_4_;
        auVar100._4_4_ = local_ac0 * auVar50._4_4_;
        auVar100._8_4_ = local_ac0 * auVar50._8_4_;
        auVar100._12_4_ = local_ac0 * auVar50._12_4_;
        auVar100._16_4_ = local_ac0 * 0.0;
        auVar100._20_4_ = local_ac0 * 0.0;
        auVar100._24_4_ = local_ac0 * 0.0;
        auVar100._28_4_ = 0;
        auVar40 = vfmadd231ps_fma(auVar100,local_e40,ZEXT1632(auVar40));
        auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),local_e60,ZEXT1632(auVar49));
        auVar6 = vsubps_avx(auVar45,auVar53);
        auVar88._0_4_ = auVar45._0_4_ + auVar53._0_4_;
        auVar88._4_4_ = auVar45._4_4_ + auVar53._4_4_;
        auVar88._8_4_ = auVar45._8_4_ + auVar53._8_4_;
        auVar88._12_4_ = auVar45._12_4_ + auVar53._12_4_;
        auVar88._16_4_ = auVar45._16_4_ + auVar53._16_4_;
        auVar88._20_4_ = auVar45._20_4_ + auVar53._20_4_;
        auVar88._24_4_ = auVar45._24_4_ + auVar53._24_4_;
        auVar88._28_4_ = auVar45._28_4_ + auVar53._28_4_;
        auVar53 = vsubps_avx(auVar52,auVar66);
        auVar104._0_4_ = auVar52._0_4_ + auVar66._0_4_;
        auVar104._4_4_ = auVar52._4_4_ + auVar66._4_4_;
        auVar104._8_4_ = auVar52._8_4_ + auVar66._8_4_;
        auVar104._12_4_ = auVar52._12_4_ + auVar66._12_4_;
        auVar104._16_4_ = auVar52._16_4_ + auVar66._16_4_;
        auVar104._20_4_ = auVar52._20_4_ + auVar66._20_4_;
        auVar104._24_4_ = auVar52._24_4_ + auVar66._24_4_;
        auVar104._28_4_ = auVar52._28_4_ + auVar66._28_4_;
        auVar66 = vsubps_avx(auVar101,auVar5);
        auVar82._0_4_ = auVar101._0_4_ + auVar5._0_4_;
        auVar82._4_4_ = auVar101._4_4_ + auVar5._4_4_;
        auVar82._8_4_ = auVar101._8_4_ + auVar5._8_4_;
        auVar82._12_4_ = auVar101._12_4_ + auVar5._12_4_;
        auVar82._16_4_ = auVar101._16_4_ + auVar5._16_4_;
        auVar82._20_4_ = auVar101._20_4_ + auVar5._20_4_;
        auVar82._24_4_ = auVar101._24_4_ + auVar5._24_4_;
        auVar82._28_4_ = fVar111 + auVar5._28_4_;
        auVar101._4_4_ = auVar104._4_4_ * auVar66._4_4_;
        auVar101._0_4_ = auVar104._0_4_ * auVar66._0_4_;
        auVar101._8_4_ = auVar104._8_4_ * auVar66._8_4_;
        auVar101._12_4_ = auVar104._12_4_ * auVar66._12_4_;
        auVar101._16_4_ = auVar104._16_4_ * auVar66._16_4_;
        auVar101._20_4_ = auVar104._20_4_ * auVar66._20_4_;
        auVar101._24_4_ = auVar104._24_4_ * auVar66._24_4_;
        auVar101._28_4_ = fVar111;
        auVar50 = vfmsub231ps_fma(auVar101,auVar53,auVar82);
        auVar5._4_4_ = auVar82._4_4_ * auVar6._4_4_;
        auVar5._0_4_ = auVar82._0_4_ * auVar6._0_4_;
        auVar5._8_4_ = auVar82._8_4_ * auVar6._8_4_;
        auVar5._12_4_ = auVar82._12_4_ * auVar6._12_4_;
        auVar5._16_4_ = auVar82._16_4_ * auVar6._16_4_;
        auVar5._20_4_ = auVar82._20_4_ * auVar6._20_4_;
        auVar5._24_4_ = auVar82._24_4_ * auVar6._24_4_;
        auVar5._28_4_ = auVar82._28_4_;
        auVar49 = vfmsub231ps_fma(auVar5,auVar66,auVar88);
        auVar13._4_4_ = auVar88._4_4_ * auVar53._4_4_;
        auVar13._0_4_ = auVar88._0_4_ * auVar53._0_4_;
        auVar13._8_4_ = auVar88._8_4_ * auVar53._8_4_;
        auVar13._12_4_ = auVar88._12_4_ * auVar53._12_4_;
        auVar13._16_4_ = auVar88._16_4_ * auVar53._16_4_;
        auVar13._20_4_ = auVar88._20_4_ * auVar53._20_4_;
        auVar13._24_4_ = auVar88._24_4_ * auVar53._24_4_;
        auVar13._28_4_ = auVar88._28_4_;
        auVar61 = vfmsub231ps_fma(auVar13,auVar6,auVar104);
        auVar89._0_4_ = local_ac0 * auVar61._0_4_;
        auVar89._4_4_ = local_ac0 * auVar61._4_4_;
        auVar89._8_4_ = local_ac0 * auVar61._8_4_;
        auVar89._12_4_ = local_ac0 * auVar61._12_4_;
        auVar89._16_4_ = local_ac0 * 0.0;
        auVar89._20_4_ = local_ac0 * 0.0;
        auVar89._24_4_ = local_ac0 * 0.0;
        auVar89._28_4_ = 0;
        auVar49 = vfmadd231ps_fma(auVar89,local_e40,ZEXT1632(auVar49));
        auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),local_e60,ZEXT1632(auVar50));
        fVar126 = auVar49._0_4_ + auVar43._0_4_ + auVar40._0_4_;
        fVar127 = auVar49._4_4_ + auVar43._4_4_ + auVar40._4_4_;
        fVar128 = auVar49._8_4_ + auVar43._8_4_ + auVar40._8_4_;
        fVar130 = auVar49._12_4_ + auVar43._12_4_ + auVar40._12_4_;
        local_ce0 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar127,fVar126))));
        auVar83._8_4_ = 0x7fffffff;
        auVar83._0_8_ = 0x7fffffff7fffffff;
        auVar83._12_4_ = 0x7fffffff;
        auVar83._16_4_ = 0x7fffffff;
        auVar83._20_4_ = 0x7fffffff;
        auVar83._24_4_ = 0x7fffffff;
        auVar83._28_4_ = 0x7fffffff;
        local_b60 = ZEXT1632(auVar43);
        auVar44 = vminps_avx(local_b60,ZEXT1632(auVar40));
        auVar44 = vminps_avx(auVar44,ZEXT1632(auVar49));
        local_bc0 = vandps_avx(local_ce0,auVar83);
        fVar111 = local_bc0._0_4_ * 1.1920929e-07;
        fVar115 = local_bc0._4_4_ * 1.1920929e-07;
        auVar14._4_4_ = fVar115;
        auVar14._0_4_ = fVar111;
        fVar116 = local_bc0._8_4_ * 1.1920929e-07;
        auVar14._8_4_ = fVar116;
        fVar117 = local_bc0._12_4_ * 1.1920929e-07;
        auVar14._12_4_ = fVar117;
        fVar118 = local_bc0._16_4_ * 1.1920929e-07;
        auVar14._16_4_ = fVar118;
        fVar119 = local_bc0._20_4_ * 1.1920929e-07;
        auVar14._20_4_ = fVar119;
        fVar120 = local_bc0._24_4_ * 1.1920929e-07;
        auVar14._24_4_ = fVar120;
        auVar14._28_4_ = 0x34000000;
        auVar109._0_8_ = CONCAT44(fVar115,fVar111) ^ 0x8000000080000000;
        auVar109._8_4_ = -fVar116;
        auVar109._12_4_ = -fVar117;
        auVar109._16_4_ = -fVar118;
        auVar109._20_4_ = -fVar119;
        auVar109._24_4_ = -fVar120;
        auVar109._28_4_ = 0xb4000000;
        auVar44 = vcmpps_avx(auVar44,auVar109,5);
        auVar101 = ZEXT1632(auVar40);
        auVar52 = vmaxps_avx(local_b60,auVar101);
        auVar45 = vmaxps_avx(auVar52,ZEXT1632(auVar49));
        auVar45 = vcmpps_avx(auVar45,auVar14,2);
        auVar45 = vorps_avx(auVar44,auVar45);
        if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar45 >> 0x7f,0) != '\0') ||
              (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar45 >> 0xbf,0) != '\0') ||
            (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar45[0x1f] < '\0') {
          auVar15._4_4_ = fVar135 * local_aa0._4_4_;
          auVar15._0_4_ = fVar132 * local_aa0._0_4_;
          auVar15._8_4_ = fVar137 * local_aa0._8_4_;
          auVar15._12_4_ = fVar139 * local_aa0._12_4_;
          auVar15._16_4_ = fVar140 * local_aa0._16_4_;
          auVar15._20_4_ = fVar141 * local_aa0._20_4_;
          auVar15._24_4_ = fVar142 * local_aa0._24_4_;
          auVar15._28_4_ = auVar44._28_4_;
          auVar16._4_4_ = fVar58 * auVar87._4_4_;
          auVar16._0_4_ = fVar56 * auVar87._0_4_;
          auVar16._8_4_ = fVar60 * auVar87._8_4_;
          auVar16._12_4_ = fVar134 * auVar87._12_4_;
          auVar16._16_4_ = fVar138 * auVar87._16_4_;
          auVar16._20_4_ = fVar146 * auVar87._20_4_;
          auVar16._24_4_ = fVar150 * auVar87._24_4_;
          auVar16._28_4_ = auVar52._28_4_;
          auVar43 = vfmsub213ps_fma(auVar87,local_b00,auVar15);
          auVar17._4_4_ = fVar57 * auVar53._4_4_;
          auVar17._0_4_ = fVar55 * auVar53._0_4_;
          auVar17._8_4_ = fVar59 * auVar53._8_4_;
          auVar17._12_4_ = fVar129 * auVar53._12_4_;
          auVar17._16_4_ = fVar136 * auVar53._16_4_;
          auVar17._20_4_ = fVar145 * auVar53._20_4_;
          auVar17._24_4_ = fVar147 * auVar53._24_4_;
          auVar17._28_4_ = 0x34000000;
          auVar18._4_4_ = fVar58 * auVar66._4_4_;
          auVar18._0_4_ = fVar56 * auVar66._0_4_;
          auVar18._8_4_ = fVar60 * auVar66._8_4_;
          auVar18._12_4_ = fVar134 * auVar66._12_4_;
          auVar18._16_4_ = fVar138 * auVar66._16_4_;
          auVar18._20_4_ = fVar146 * auVar66._20_4_;
          auVar18._24_4_ = fVar150 * auVar66._24_4_;
          auVar18._28_4_ = 0;
          auVar40 = vfmsub213ps_fma(auVar66,local_ae0,auVar17);
          auVar44 = vandps_avx(auVar15,auVar83);
          auVar52 = vandps_avx(auVar17,auVar83);
          auVar44 = vcmpps_avx(auVar44,auVar52,1);
          local_b40 = vblendvps_avx(ZEXT1632(auVar40),ZEXT1632(auVar43),auVar44);
          auVar19._4_4_ = fVar135 * auVar6._4_4_;
          auVar19._0_4_ = fVar132 * auVar6._0_4_;
          auVar19._8_4_ = fVar137 * auVar6._8_4_;
          auVar19._12_4_ = fVar139 * auVar6._12_4_;
          auVar19._16_4_ = fVar140 * auVar6._16_4_;
          auVar19._20_4_ = fVar141 * auVar6._20_4_;
          auVar19._24_4_ = fVar142 * auVar6._24_4_;
          auVar19._28_4_ = local_b40._28_4_;
          auVar43 = vfmsub213ps_fma(auVar6,local_b00,auVar18);
          auVar20._4_4_ = auVar67._4_4_ * fVar57;
          auVar20._0_4_ = auVar67._0_4_ * fVar55;
          auVar20._8_4_ = auVar67._8_4_ * fVar59;
          auVar20._12_4_ = auVar67._12_4_ * fVar129;
          auVar20._16_4_ = auVar67._16_4_ * fVar136;
          auVar20._20_4_ = auVar67._20_4_ * fVar145;
          auVar20._24_4_ = auVar67._24_4_ * fVar147;
          auVar20._28_4_ = auVar44._28_4_;
          auVar40 = vfmsub213ps_fma(local_aa0,local_b20,auVar20);
          auVar44 = vandps_avx(auVar20,auVar83);
          auVar52 = vandps_avx(auVar18,auVar83);
          auVar44 = vcmpps_avx(auVar44,auVar52,1);
          auVar66 = vblendvps_avx(ZEXT1632(auVar43),ZEXT1632(auVar40),auVar44);
          auVar43 = vfmsub213ps_fma(auVar67,local_ae0,auVar16);
          auVar40 = vfmsub213ps_fma(auVar53,local_b20,auVar19);
          auVar44 = vandps_avx(auVar16,auVar83);
          auVar52 = vandps_avx(auVar19,auVar83);
          auVar44 = vcmpps_avx(auVar44,auVar52,1);
          auVar44 = vblendvps_avx(ZEXT1632(auVar40),ZEXT1632(auVar43),auVar44);
          auVar43 = vpackssdw_avx(auVar45._0_16_,auVar45._16_16_);
          fVar111 = auVar44._0_4_;
          auVar84._0_4_ = fVar111 * local_ac0;
          fVar55 = auVar44._4_4_;
          auVar84._4_4_ = fVar55 * local_ac0;
          fVar56 = auVar44._8_4_;
          auVar84._8_4_ = fVar56 * local_ac0;
          fVar57 = auVar44._12_4_;
          auVar84._12_4_ = fVar57 * local_ac0;
          fVar58 = auVar44._16_4_;
          auVar84._16_4_ = fVar58 * local_ac0;
          fVar59 = auVar44._20_4_;
          auVar84._20_4_ = fVar59 * local_ac0;
          fVar60 = auVar44._24_4_;
          auVar84._24_4_ = fVar60 * local_ac0;
          auVar84._28_4_ = 0;
          auVar40 = vfmadd213ps_fma(local_e40,auVar66,auVar84);
          auVar40 = vfmadd213ps_fma(local_e60,local_b40,ZEXT1632(auVar40));
          auVar52 = ZEXT1632(CONCAT412(auVar40._12_4_ + auVar40._12_4_,
                                       CONCAT48(auVar40._8_4_ + auVar40._8_4_,
                                                CONCAT44(auVar40._4_4_ + auVar40._4_4_,
                                                         auVar40._0_4_ + auVar40._0_4_))));
          auVar21._4_4_ = fVar55 * fVar148;
          auVar21._0_4_ = fVar111 * fVar143;
          auVar21._8_4_ = fVar56 * fVar85;
          auVar21._12_4_ = fVar57 * fVar123;
          auVar21._16_4_ = fVar58 * fVar125;
          auVar21._20_4_ = fVar59 * fVar131;
          auVar21._24_4_ = fVar60 * fVar91;
          auVar21._28_4_ = auVar45._28_4_;
          auVar40 = vfmadd213ps_fma(auVar46,auVar66,auVar21);
          auVar49 = vfmadd213ps_fma(auVar105,local_b40,ZEXT1632(auVar40));
          auVar44 = vrcpps_avx(auVar52);
          auVar113._8_4_ = 0x3f800000;
          auVar113._0_8_ = 0x3f8000003f800000;
          auVar113._12_4_ = 0x3f800000;
          auVar113._16_4_ = 0x3f800000;
          auVar113._20_4_ = 0x3f800000;
          auVar113._24_4_ = 0x3f800000;
          auVar113._28_4_ = 0x3f800000;
          auVar40 = vfnmadd213ps_fma(auVar44,auVar52,auVar113);
          auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar44,auVar44);
          local_9a0 = ZEXT1632(CONCAT412(auVar40._12_4_ * (auVar49._12_4_ + auVar49._12_4_),
                                         CONCAT48(auVar40._8_4_ * (auVar49._8_4_ + auVar49._8_4_),
                                                  CONCAT44(auVar40._4_4_ *
                                                           (auVar49._4_4_ + auVar49._4_4_),
                                                           auVar40._0_4_ *
                                                           (auVar49._0_4_ + auVar49._0_4_)))));
          uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x60);
          auVar105._4_4_ = uVar27;
          auVar105._0_4_ = uVar27;
          auVar105._8_4_ = uVar27;
          auVar105._12_4_ = uVar27;
          auVar105._16_4_ = uVar27;
          auVar105._20_4_ = uVar27;
          auVar105._24_4_ = uVar27;
          auVar105._28_4_ = uVar27;
          uVar27 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x100);
          local_d00._4_4_ = uVar27;
          local_d00._0_4_ = uVar27;
          local_d00._8_4_ = uVar27;
          local_d00._12_4_ = uVar27;
          local_d00._16_4_ = uVar27;
          local_d00._20_4_ = uVar27;
          local_d00._24_4_ = uVar27;
          local_d00._28_4_ = uVar27;
          auVar94 = ZEXT3264(local_d00);
          auVar44 = vcmpps_avx(auVar105,local_9a0,2);
          auVar45 = vcmpps_avx(local_9a0,local_d00,2);
          auVar44 = vandps_avx(auVar45,auVar44);
          auVar40 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
          auVar43 = vpand_avx(auVar40,auVar43);
          auVar44 = vpmovsxwd_avx2(auVar43);
          if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0x7f,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar44 >> 0xbf,0) != '\0') ||
              (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar44[0x1f] < '\0') {
            auVar44 = vcmpps_avx(auVar52,_DAT_01f7b000,4);
            auVar40 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
            auVar43 = vpand_avx(auVar43,auVar40);
            local_a00 = vpmovsxwd_avx2(auVar43);
            if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_a00 >> 0x7f,0) != '\0') ||
                  (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_a00 >> 0xbf,0) != '\0') ||
                (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_a00[0x1f] < '\0') {
              local_a20 = &local_e89;
              auVar44 = vsubps_avx(local_ce0,auVar101);
              local_a80 = vblendvps_avx(local_b60,auVar44,local_b80);
              auVar44 = vsubps_avx(local_ce0,local_b60);
              local_a60 = vblendvps_avx(auVar101,auVar44,local_b80);
              local_980[0] = local_b40._0_4_ * (float)local_ba0._0_4_;
              local_980[1] = local_b40._4_4_ * (float)local_ba0._4_4_;
              local_980[2] = local_b40._8_4_ * fStack_b98;
              local_980[3] = local_b40._12_4_ * fStack_b94;
              fStack_970 = local_b40._16_4_ * fStack_b90;
              fStack_96c = local_b40._20_4_ * fStack_b8c;
              fStack_968 = local_b40._24_4_ * fStack_b88;
              uStack_964 = local_b80._28_4_;
              local_960[0] = (float)local_ba0._0_4_ * auVar66._0_4_;
              local_960[1] = (float)local_ba0._4_4_ * auVar66._4_4_;
              local_960[2] = fStack_b98 * auVar66._8_4_;
              local_960[3] = fStack_b94 * auVar66._12_4_;
              fStack_950 = fStack_b90 * auVar66._16_4_;
              fStack_94c = fStack_b8c * auVar66._20_4_;
              fStack_948 = fStack_b88 * auVar66._24_4_;
              uStack_944 = auVar66._28_4_;
              local_940._4_4_ = (float)local_ba0._4_4_ * fVar55;
              local_940._0_4_ = (float)local_ba0._0_4_ * fVar111;
              local_940._8_4_ = fStack_b98 * fVar56;
              local_940._12_4_ = fStack_b94 * fVar57;
              local_940._16_4_ = fStack_b90 * fVar58;
              local_940._20_4_ = fStack_b8c * fVar59;
              local_940._24_4_ = fStack_b88 * fVar60;
              local_940._28_4_ = auVar66._28_4_;
              pGVar34 = (local_d88->geometries).items[local_e68].ptr;
              if ((pGVar34->mask & *(uint *)(local_e78 + local_e80 * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar34->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0162fac0:
                  *(undefined4 *)(local_e78 + local_e80 * 4 + 0x100) = 0xff800000;
                  goto LAB_0162fae5;
                }
                auVar48._0_8_ = (ulong)CONCAT24(uVar1,(uint)uVar1) & 0x7fff00007fff;
                auVar48._8_4_ = local_e6c;
                auVar48._12_4_ = local_e6c;
                auVar48._16_4_ = local_e6c;
                auVar48._20_4_ = local_e6c;
                auVar48._24_4_ = local_e6c;
                auVar48._28_4_ = local_e6c;
                auVar44 = vpaddd_avx2(auVar48,_DAT_01fb7740);
                auVar54._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                auVar54._8_4_ = local_e70;
                auVar54._12_4_ = local_e70;
                auVar54._16_4_ = local_e70;
                auVar54._20_4_ = local_e70;
                auVar54._24_4_ = local_e70;
                auVar54._28_4_ = local_e70;
                auVar52 = vpaddd_avx2(auVar54,_DAT_01fb7760);
                auVar93._0_4_ = (float)(int)(*(ushort *)(local_d90 + 8 + local_d98) - 1);
                auVar93._4_12_ = local_ae0._4_12_;
                auVar40 = vrcpss_avx(auVar93,auVar93);
                auVar103._0_4_ = (float)(int)(*(ushort *)(local_d90 + 10 + local_d98) - 1);
                auVar103._4_12_ = local_ae0._4_12_;
                auVar49 = vfnmadd213ss_fma(auVar93,auVar40,SUB6416(ZEXT464(0x40000000),0));
                fVar143 = auVar40._0_4_ * auVar49._0_4_;
                auVar40 = vrcpss_avx(auVar103,auVar103);
                auVar49 = vfnmadd213ss_fma(auVar103,auVar40,SUB6416(ZEXT464(0x40000000),0));
                fVar148 = auVar40._0_4_ * auVar49._0_4_;
                auVar45 = vcvtdq2ps_avx(auVar44);
                auVar52 = vcvtdq2ps_avx(auVar52);
                auVar44 = vrcpps_avx(local_ce0);
                auVar90._8_4_ = 0x3f800000;
                auVar90._0_8_ = 0x3f8000003f800000;
                auVar90._12_4_ = 0x3f800000;
                auVar90._16_4_ = 0x3f800000;
                auVar90._20_4_ = 0x3f800000;
                auVar90._24_4_ = 0x3f800000;
                auVar90._28_4_ = 0x3f800000;
                auVar40 = vfnmadd213ps_fma(local_ce0,auVar44,auVar90);
                auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar44,auVar44);
                auVar69._8_4_ = 0x219392ef;
                auVar69._0_8_ = 0x219392ef219392ef;
                auVar69._12_4_ = 0x219392ef;
                auVar69._16_4_ = 0x219392ef;
                auVar69._20_4_ = 0x219392ef;
                auVar69._24_4_ = 0x219392ef;
                auVar69._28_4_ = 0x219392ef;
                auVar44 = vcmpps_avx(local_bc0,auVar69,5);
                auVar44 = vandps_avx(ZEXT1632(auVar40),auVar44);
                auVar22._4_4_ =
                     (fVar127 * auVar45._4_4_ + local_a80._4_4_) * fVar143 * auVar44._4_4_;
                auVar22._0_4_ =
                     (fVar126 * auVar45._0_4_ + local_a80._0_4_) * fVar143 * auVar44._0_4_;
                auVar22._8_4_ =
                     (fVar128 * auVar45._8_4_ + local_a80._8_4_) * fVar143 * auVar44._8_4_;
                auVar22._12_4_ =
                     (fVar130 * auVar45._12_4_ + local_a80._12_4_) * fVar143 * auVar44._12_4_;
                auVar22._16_4_ =
                     (auVar45._16_4_ * 0.0 + local_a80._16_4_) * fVar143 * auVar44._16_4_;
                auVar22._20_4_ =
                     (auVar45._20_4_ * 0.0 + local_a80._20_4_) * fVar143 * auVar44._20_4_;
                auVar22._24_4_ =
                     (auVar45._24_4_ * 0.0 + local_a80._24_4_) * fVar143 * auVar44._24_4_;
                auVar22._28_4_ = auVar45._28_4_ + local_a80._28_4_;
                local_9e0 = vminps_avx(auVar22,auVar90);
                auVar23._4_4_ =
                     (fVar127 * auVar52._4_4_ + local_a60._4_4_) * fVar148 * auVar44._4_4_;
                auVar23._0_4_ =
                     (fVar126 * auVar52._0_4_ + local_a60._0_4_) * fVar148 * auVar44._0_4_;
                auVar23._8_4_ =
                     (fVar128 * auVar52._8_4_ + local_a60._8_4_) * fVar148 * auVar44._8_4_;
                auVar23._12_4_ =
                     (fVar130 * auVar52._12_4_ + local_a60._12_4_) * fVar148 * auVar44._12_4_;
                auVar23._16_4_ =
                     (auVar52._16_4_ * 0.0 + local_a60._16_4_) * fVar148 * auVar44._16_4_;
                auVar23._20_4_ =
                     (auVar52._20_4_ * 0.0 + local_a60._20_4_) * fVar148 * auVar44._20_4_;
                auVar23._24_4_ =
                     (auVar52._24_4_ * 0.0 + local_a60._24_4_) * fVar148 * auVar44._24_4_;
                auVar23._28_4_ = local_9e0._28_4_;
                local_9c0 = vminps_avx(auVar23,auVar90);
                auVar43 = vpacksswb_avx(auVar43,auVar43);
                uVar35 = 0;
                uVar28 = (ulong)(byte)(SUB161(auVar43 >> 7,0) & 1 |
                                       (SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar43 >> 0x3f,0) << 7);
                for (uVar36 = uVar28; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
                {
                  uVar35 = uVar35 + 1;
                }
                local_ca0._0_4_ = local_ca0._4_4_;
                uStack_c98._0_4_ = local_ca0._4_4_;
                uStack_c98._4_4_ = local_ca0._4_4_;
                uStack_c90._0_4_ = local_ca0._4_4_;
                uStack_c90._4_4_ = local_ca0._4_4_;
                uStack_c88._0_4_ = local_ca0._4_4_;
                uStack_c88._4_4_ = local_ca0._4_4_;
                local_cc0._4_4_ = uVar26;
                local_cc0._0_4_ = uVar26;
                local_cc0._8_4_ = uVar26;
                local_cc0._12_4_ = uVar26;
                local_cc0._16_4_ = uVar26;
                local_cc0._20_4_ = uVar26;
                local_cc0._24_4_ = uVar26;
                local_cc0._28_4_ = uVar26;
                auStack_d18 = auVar67._8_24_;
                local_d20 = pGVar34;
                fStack_abc = local_ac0;
                fStack_ab8 = local_ac0;
                fStack_ab4 = local_ac0;
                fStack_ab0 = local_ac0;
                fStack_aac = local_ac0;
                fStack_aa8 = local_ac0;
                fStack_aa4 = local_ac0;
                local_a40 = local_ce0;
                while (uVar28 != 0) {
                  local_8c0 = *(undefined4 *)(local_9e0 + uVar35 * 4);
                  local_8a0 = *(undefined4 *)(local_9c0 + uVar35 * 4);
                  *(float *)(local_e78 + local_e80 * 4 + 0x100) = local_980[uVar35 - 8];
                  fVar143 = local_980[uVar35];
                  auVar70._4_4_ = fVar143;
                  auVar70._0_4_ = fVar143;
                  auVar70._8_4_ = fVar143;
                  auVar70._12_4_ = fVar143;
                  auVar70._16_4_ = fVar143;
                  auVar70._20_4_ = fVar143;
                  auVar70._24_4_ = fVar143;
                  auVar70._28_4_ = fVar143;
                  fVar148 = local_960[uVar35];
                  local_900._4_4_ = fVar148;
                  local_900._0_4_ = fVar148;
                  local_900._8_4_ = fVar148;
                  local_900._12_4_ = fVar148;
                  local_900._16_4_ = fVar148;
                  local_900._20_4_ = fVar148;
                  local_900._24_4_ = fVar148;
                  local_900._28_4_ = fVar148;
                  local_8e0 = *(undefined4 *)(local_940 + uVar35 * 4);
                  local_d50.context = context->user;
                  local_920[0] = (RTCHitN)SUB41(fVar143,0);
                  local_920[1] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[4] = (RTCHitN)SUB41(fVar143,0);
                  local_920[5] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[8] = (RTCHitN)SUB41(fVar143,0);
                  local_920[9] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[0xc] = (RTCHitN)SUB41(fVar143,0);
                  local_920[0xd] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[0x10] = (RTCHitN)SUB41(fVar143,0);
                  local_920[0x11] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[0x14] = (RTCHitN)SUB41(fVar143,0);
                  local_920[0x15] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[0x18] = (RTCHitN)SUB41(fVar143,0);
                  local_920[0x19] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  local_920[0x1c] = (RTCHitN)SUB41(fVar143,0);
                  local_920[0x1d] = (RTCHitN)(char)((uint)fVar143 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)fVar143 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)fVar143 >> 0x18);
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  local_880 = local_cc0._0_8_;
                  uStack_878 = local_cc0._8_8_;
                  uStack_870 = local_cc0._16_8_;
                  uStack_868 = local_cc0._24_8_;
                  local_860 = local_ca0;
                  uStack_858 = uStack_c98;
                  uStack_850 = uStack_c90;
                  uStack_848 = uStack_c88;
                  auVar44 = vpcmpeqd_avx2(auVar70,auVar70);
                  uStack_83c = (local_d50.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_d50.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_c80 = local_be0;
                  local_d50.valid = (int *)local_c80;
                  local_d50.geometryUserPtr = pGVar34->userPtr;
                  local_d50.ray = (RTCRayN *)local_e78;
                  local_d50.hit = local_920;
                  local_d50.N = 8;
                  uVar36 = uVar35;
                  if (pGVar34->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_e60._0_8_ = uVar28;
                    local_e40._0_8_ = uVar35;
                    auVar44 = ZEXT1632(auVar44._0_16_);
                    (*pGVar34->occlusionFilterN)(&local_d50);
                    auVar94 = ZEXT3264(local_d00);
                    auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                    uVar28 = local_e60._0_8_;
                    pGVar34 = local_d20;
                    uVar36 = local_e40._0_8_;
                  }
                  auVar52 = vpcmpeqd_avx2(local_c80,_DAT_01f7b000);
                  auVar45 = auVar44 & ~auVar52;
                  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar45 >> 0x7f,0) == '\0') &&
                        (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar45 >> 0xbf,0) == '\0') &&
                      (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar45[0x1f]) {
                    auVar52 = auVar52 ^ auVar44;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar34->field_8).field_0x2 & 0x40) != 0)))) {
                      local_e60._0_8_ = uVar28;
                      local_e40._0_8_ = uVar36;
                      auVar44 = ZEXT1632(auVar44._0_16_);
                      (*p_Var4)(&local_d50);
                      auVar94 = ZEXT3264(local_d00);
                      auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                      uVar28 = local_e60._0_8_;
                      pGVar34 = local_d20;
                      uVar36 = local_e40._0_8_;
                    }
                    auVar45 = vpcmpeqd_avx2(local_c80,_DAT_01f7b000);
                    auVar52 = auVar45 ^ auVar44;
                    auVar71._8_4_ = 0xff800000;
                    auVar71._0_8_ = 0xff800000ff800000;
                    auVar71._12_4_ = 0xff800000;
                    auVar71._16_4_ = 0xff800000;
                    auVar71._20_4_ = 0xff800000;
                    auVar71._24_4_ = 0xff800000;
                    auVar71._28_4_ = 0xff800000;
                    auVar44 = vblendvps_avx(auVar71,*(undefined1 (*) [32])(local_d50.ray + 0x100),
                                            auVar45);
                    *(undefined1 (*) [32])(local_d50.ray + 0x100) = auVar44;
                  }
                  if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar52 >> 0x7f,0) != '\0') ||
                        (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar52 >> 0xbf,0) != '\0') ||
                      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar52[0x1f] < '\0') goto LAB_0162fac0;
                  *(int *)(local_e78 + local_e80 * 4 + 0x100) = auVar94._0_4_;
                  uVar35 = 0;
                  uVar28 = uVar28 ^ 1L << (uVar36 & 0x3f);
                  for (uVar36 = uVar28; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000
                      ) {
                    uVar35 = uVar35 + 1;
                  }
                }
              }
            }
          }
        }
        auVar110 = ZEXT1664(local_bf0);
        auVar114 = ZEXT1664(local_c00);
        auVar122 = ZEXT1664(local_c10);
        uVar35 = local_de8;
        uVar36 = local_df0;
        fVar123 = local_c20;
        fVar56 = fStack_c1c;
        fVar57 = fStack_c18;
        fVar58 = fStack_c14;
        fVar125 = local_c30;
        fVar59 = fStack_c2c;
        fVar60 = fStack_c28;
        fVar129 = fStack_c24;
        fVar131 = local_c40;
        fVar134 = fStack_c3c;
        fVar136 = fStack_c38;
        fVar138 = fStack_c34;
        fVar143 = local_c50;
        fVar145 = fStack_c4c;
        fVar146 = fStack_c48;
        fVar147 = fStack_c44;
        fVar148 = local_c60;
        fVar150 = fStack_c5c;
        fVar115 = fStack_c58;
        fVar116 = fStack_c54;
      }
      auVar106 = ZEXT1664(local_d80);
      fVar85 = local_d60;
      fVar91 = fStack_d5c;
      fVar111 = fStack_d58;
      fVar55 = fStack_d54;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }